

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  pointer peVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  entry_type eVar4;
  int32_t iVar5;
  const_iterator __cbeg;
  mapped_type *pmVar6;
  size_type sVar7;
  pointer peVar8;
  uint32_t h;
  pointer *ppiVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  pointer piVar13;
  iterator __position;
  vector<int,std::allocator<int>> *this_01;
  iterator __begin2;
  int *piVar14;
  int32_t j;
  int iVar15;
  pointer piVar16;
  ulong uVar17;
  string_view w;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> local_78;
  int *local_58;
  pointer piStack_50;
  int *local_48;
  vector<int,std::allocator<int>> *local_40;
  int local_34;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_48 = (int *)0x0;
  local_58 = (int *)0x0;
  piStack_50 = (int *)0x0;
  piVar16 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (piVar16 !=
      (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     ) {
    do {
      if (*piVar16 < this->nwords_) {
        ppiVar9 = &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        __position._M_current =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        piVar13 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        this_01 = (vector<int,std::allocator<int>> *)&local_78;
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_0012b036;
LAB_0012b017:
        *piVar13 = *piVar16;
        *ppiVar9 = piVar13 + 1;
      }
      else {
        ppiVar9 = &piStack_50;
        __position._M_current = piStack_50;
        piVar13 = piStack_50;
        this_01 = (vector<int,std::allocator<int>> *)&local_58;
        if (piStack_50 != local_48) goto LAB_0012b017;
LAB_0012b036:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_01,__position,piVar16);
      }
      piVar16 = piVar16 + 1;
    } while (piVar16 !=
             (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  piVar13 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  piVar16 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar16,piVar13);
  }
  std::vector<int,_std::allocator<int>_>::operator=(idx,&local_78);
  piVar16 = piStack_50;
  if (piStack_50 != local_58) {
    iVar15 = 0;
    piVar14 = local_58;
    local_40 = (vector<int,std::allocator<int>> *)idx;
    do {
      local_34 = *piVar14 - this->nwords_;
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_34);
      *pmVar6 = iVar15;
      iVar15 = iVar15 + 1;
      piVar14 = piVar14 + 1;
    } while (piVar14 != piVar16);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_40,*(undefined8 *)(local_40 + 8),local_58,piStack_50);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar16 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar13 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar16 != piVar13) {
    memset(piVar16,0xff,((long)piVar13 + (-4 - (long)piVar16) & 0xfffffffffffffffcU) + 4);
  }
  this_00 = &this->words_;
  peVar8 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)peVar8;
  if (lVar12 != 0) {
    uVar17 = 0;
    iVar15 = 0;
    do {
      eVar4 = getType(this,(int32_t)uVar17);
      uVar10 = (ulong)iVar15;
      if ((eVar4 == label) ||
         ((uVar10 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) &&
          (uVar17 == (uint)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10])))) {
        local_40 = (vector<int,std::allocator<int>> *)CONCAT44(local_40._4_4_,iVar15);
        peVar1 = (this_00->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        peVar8 = peVar1 + uVar10;
        std::__cxx11::string::_M_assign((string *)peVar8);
        peVar8->type = peVar1[uVar17].type;
        peVar8->count = peVar1[uVar17].count;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&peVar8->subwords,&peVar1[uVar17].subwords);
        peVar8 = (this_00->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        _Var2._M_p = peVar8[uVar10].word._M_dataplus._M_p;
        sVar3 = peVar8[uVar10].word._M_string_length;
        h = 0x811c9dc5;
        if (sVar3 != 0) {
          sVar7 = 0;
          do {
            h = ((int)_Var2._M_p[sVar7] ^ h) * 0x1000193;
            sVar7 = sVar7 + 1;
          } while (sVar3 != sVar7);
        }
        w._M_str = _Var2._M_p;
        w._M_len = sVar3;
        iVar5 = find(this,w,h);
        (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = (int)local_40;
        iVar15 = (int)local_40 + 1;
      }
      uVar17 = uVar17 + 1;
      peVar8 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)(this->words_).
                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)peVar8;
      uVar10 = (lVar12 >> 3) * -0x71c71c71c71c71c7;
    } while (uVar17 <= uVar10 && uVar10 - uVar17 != 0);
  }
  iVar15 = (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar15;
  lVar11 = (long)iVar15 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar11;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (this_00,peVar8 + lVar11,(entry *)((long)&(peVar8->word)._M_dataplus._M_p + lVar12));
  initNgrams(this);
  if (local_58 != (int *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {
      words.push_back(*it);
    } else {
      ngrams.push_back(*it);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}